

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture2DShadowCase::Texture2DShadowCase
          (Texture2DShadowCase *this,Context *context,char *name,char *desc,deUint32 minFilter,
          deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,deUint32 format,int width,int height,
          deUint32 compareFunc)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 magFilter_local;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  Texture2DShadowCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DShadowCase_0328c600;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = format;
  this->m_width = width;
  this->m_height = height;
  this->m_compareFunc = compareFunc;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector(&this->m_textures);
  std::
  vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
  ::vector(&this->m_cases);
  context_00 = gles3::Context::getRenderContext(context);
  this_00 = gles3::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  this->m_caseNdx = 0;
  return;
}

Assistant:

Texture2DShadowCase::Texture2DShadowCase (Context& context, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 format, int width, int height, deUint32 compareFunc)
	: TestCase			(context, name, desc)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_format			(format)
	, m_width			(width)
	, m_height			(height)
	, m_compareFunc		(compareFunc)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_caseNdx			(0)
{
}